

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_rpc_client::cancel_socket(asio_rpc_client *this,error_code *err)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined8 uVar4;
  int in_ECX;
  int __type;
  error_code *in_RSI;
  asio_rpc_client *in_RDI;
  undefined1 in_stack_ffffffffffffff9f;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_ffffffffffffffa0;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    socket(in_RDI,(int)in_RSI,__type,in_ECX);
    bVar1 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open
                      (in_stack_ffffffffffffffa0);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x265263);
        iVar2 = (*peVar3->_vptr_logger[7])();
        if (2 < iVar2) {
          peVar3 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x265286);
          in_stack_ffffffffffffffa0 =
               (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)std::__cxx11::string::c_str();
          uVar4 = std::__cxx11::string::c_str();
          msg_if_given_abi_cxx11_
                    ((char *)local_30,"cancelling operations due to socket (%s:%s) timeout",
                     in_stack_ffffffffffffffa0,uVar4);
          (*peVar3->_vptr_logger[8])
                    (peVar3,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"cancel_socket",0x51a,local_30);
          std::__cxx11::string::~string(local_30);
        }
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
      asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::cancel(in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void cancel_socket(const ERROR_CODE& err) {
        if (err) { // Timer was cancelled itself, it's OK.
            return;
        }

        if (socket().is_open()) {
            p_wn("cancelling operations due to socket (%s:%s) timeout",
                host_.c_str(), port_.c_str());
            abandoned_ = true;
            socket_.cancel();
        }
    }